

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IStream * Catch::makeStream(StringRef *filename)

{
  size_type sVar1;
  char *__s1;
  int iVar2;
  IStream *pIVar3;
  streambuf *psVar4;
  char *pcVar5;
  IStream *this;
  long in_FS_OFFSET;
  ReusableStringStream RStack_78;
  StringRef local_60;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = filename->m_size;
  if (sVar1 == 0) {
    pIVar3 = (IStream *)operator_new(0x118);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__CoutStream_001ce6f8;
    std::ostream::ostream(pIVar3 + 1,*(streambuf **)(memmove + *(long *)(std::cout + -0x18)));
  }
  else {
    __s1 = filename->m_start;
    if (*__s1 == '%') {
      if (sVar1 == 6) {
        iVar2 = bcmp(__s1,"%debug",6);
        if (iVar2 == 0) {
          pIVar3 = (IStream *)operator_new(0x120);
          pIVar3->_vptr_IStream = (_func_int **)&PTR__DebugOutStream_001ce738;
          psVar4 = (streambuf *)operator_new(0x148);
          *(code **)psVar4 = sysconf;
          *(undefined8 *)(psVar4 + 8) = 0;
          *(undefined8 *)(psVar4 + 0x10) = 0;
          *(undefined8 *)(psVar4 + 0x18) = 0;
          *(undefined8 *)(psVar4 + 0x20) = 0;
          *(undefined8 *)(psVar4 + 0x28) = 0;
          *(undefined8 *)(psVar4 + 0x30) = 0;
          std::locale::locale((locale *)(psVar4 + 0x38));
          *(undefined ***)psVar4 = &PTR__StreamBufImpl_001ce778;
          *(streambuf **)(psVar4 + 0x28) = psVar4 + 0x40;
          *(streambuf **)(psVar4 + 0x20) = psVar4 + 0x40;
          *(streambuf **)(psVar4 + 0x30) = psVar4 + 0x140;
          pIVar3[1]._vptr_IStream = (_func_int **)psVar4;
          std::ostream::ostream(pIVar3 + 2,psVar4);
          goto LAB_0015d966;
        }
      }
      ReusableStringStream::ReusableStringStream(&RStack_78);
      std::__ostream_insert<char,std::char_traits<char>>
                (RStack_78.m_oss,"Unrecognised stream: \'",0x16);
      std::ostream::write((char *)RStack_78.m_oss,(long)filename->m_start);
      std::__ostream_insert<char,std::char_traits<char>>(RStack_78.m_oss,"\'",1);
      std::__cxx11::stringbuf::str();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        throw_domain_error(&local_50);
      }
      goto LAB_0015db0e;
    }
    pIVar3 = (IStream *)operator_new(0x208);
    pIVar3->_vptr_IStream = (_func_int **)&PTR__FileStream_001ce810;
    this = pIVar3 + 1;
    local_60.m_start = __s1;
    local_60.m_size = sVar1;
    std::ofstream::ofstream(this);
    pcVar5 = StringRef::c_str(&local_60);
    std::ofstream::open((char *)this,(_Ios_Openmode)pcVar5);
    if (((byte)this->_vptr_IStream[-3][(long)&pIVar3[5]._vptr_IStream] & 5) != 0) {
      ReusableStringStream::ReusableStringStream(&RStack_78);
      std::__ostream_insert<char,std::char_traits<char>>
                (RStack_78.m_oss,"Unable to open file: \'",0x16);
      std::ostream::write((char *)RStack_78.m_oss,(long)__s1);
      std::__ostream_insert<char,std::char_traits<char>>(RStack_78.m_oss,"\'",1);
      std::__cxx11::stringbuf::str();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        throw_domain_error(&local_50);
      }
      goto LAB_0015db0e;
    }
  }
LAB_0015d966:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pIVar3;
  }
LAB_0015db0e:
  __stack_chk_fail();
}

Assistant:

auto makeStream( StringRef const &filename ) -> IStream const* {
        if( filename.empty() )
            return new Detail::CoutStream();
        else if( filename[0] == '%' ) {
            if( filename == "%debug" )
                return new Detail::DebugOutStream();
            else
                CATCH_ERROR( "Unrecognised stream: '" << filename << "'" );
        }
        else
            return new Detail::FileStream( filename );
    }